

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O3

void __thiscall Simulator::var_real(Simulator *this,PCode *code)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Symbol local_a8;
  
  paVar1 = &local_a8.name_.field_2;
  pcVar2 = (code->first_)._M_dataplus._M_p;
  local_a8.name_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar2,pcVar2 + (code->first_)._M_string_length);
  local_a8.type_ = kReal;
  local_a8._36_8_ = 0;
  local_a8.value_.args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  local_a8.value_.args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  local_a8.value_.args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  local_a8.value_.args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.value_.real_value = 0.0;
  local_a8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_a8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  local_a8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_a8._121_8_ = 0;
  ScopeTree::define(&this->tree_,&local_a8);
  if (local_a8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<Symbol,_std::allocator<Symbol>_>::~vector(&local_a8.value_.args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.name_._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.name_._M_dataplus._M_p);
  }
  this->eip_ = this->eip_ + 1;
  return;
}

Assistant:

void Simulator::var_real(const PCode &code) {
    tree_.define(Symbol(code.first(), 0.0, false));
    inc_eip();
}